

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# environment.hpp
# Opt level: O1

string * __thiscall
inja::Environment::render
          (string *__return_storage_ptr__,Environment *this,string_view input,json *data)

{
  Template local_98;
  
  parse(&local_98,this,input);
  render(__return_storage_ptr__,this,&local_98,data);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<inja::BlockStatementNode>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<inja::BlockStatementNode>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<inja::BlockStatementNode>_>_>_>
  ::~_Rb_tree(&local_98.block_storage._M_t);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98.content._M_dataplus._M_p != &local_98.content.field_2) {
    operator_delete(local_98.content._M_dataplus._M_p,
                    local_98.content.field_2._M_allocated_capacity + 1);
  }
  local_98.root.super_AstNode._vptr_AstNode = (_func_int **)&PTR_accept_001b10c0;
  std::vector<std::shared_ptr<inja::AstNode>,_std::allocator<std::shared_ptr<inja::AstNode>_>_>::
  ~vector(&local_98.root.nodes);
  return __return_storage_ptr__;
}

Assistant:

std::string render(std::string_view input, const json& data) {
    return render(parse(input), data);
  }